

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_17::NameGenerator::BeginBlockExpr(NameGenerator *this,BlockExpr *expr)

{
  Index index;
  BlockExpr *expr_local;
  NameGenerator *this_local;
  
  index = this->label_count_;
  this->label_count_ = index + 1;
  MaybeGenerateName("$B",index,&(expr->block).label);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameGenerator::BeginBlockExpr(BlockExpr* expr) {
  MaybeGenerateName("$B", label_count_++, &expr->block.label);
  return Result::Ok;
}